

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_null_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp env;
  sexp psVar1;
  long lVar2;
  sexp core;
  sexp e;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_58;
  sexp local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_58;
  local_48.var = &local_50;
  local_50 = (sexp)0x43e;
  local_38.next = &local_48;
  local_58 = (sexp)&DAT_0000043e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  (ctx->value).context.saves = &local_38;
  local_50 = sexp_alloc_tagged_aux(ctx,0x28,0x17);
  (local_50->value).flonum = 0.0;
  (local_50->value).type.cpl = (sexp)0x0;
  (local_50->value).uvector.length = 0x23e;
  (local_50->value).bytecode.length = 0x23e;
  lVar2 = 0;
  do {
    local_58 = sexp_alloc_tagged_aux(ctx,0x18,0x19);
    env = local_50;
    psVar1 = *(sexp *)((long)&core_forms[0].name + lVar2);
    (local_58->value).flonum = *(double *)(&core_forms[0].code + lVar2);
    (local_58->value).type.cpl = psVar1;
    psVar1 = sexp_intern(ctx,(char *)(local_58->value).type.cpl,-1);
    sexp_env_define(ctx,env,psVar1,local_58);
    psVar1 = sexp_c_string(ctx,(char *)(local_58->value).type.cpl,-1);
    (local_58->value).type.cpl = psVar1;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xa0);
  (ctx->value).context.saves = local_48.next;
  return local_50;
}

Assistant:

sexp sexp_make_null_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  sexp_uint_t i;
  sexp_gc_var2(e, core);
  sexp_gc_preserve2(ctx, e, core);
  e = sexp_make_env(ctx);
  for (i=0; i<(sizeof(core_forms)/sizeof(core_forms[0])); i++) {
    core = sexp_copy_core(ctx, &core_forms[i]);
    sexp_env_define(ctx, e, sexp_intern(ctx, (char*)sexp_core_name(core), -1), core);
    sexp_core_name(core) = sexp_c_string(ctx, (char*)sexp_core_name(core), -1);
  }
  sexp_gc_release2(ctx);
  return e;
}